

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MGraph.c
# Opt level: O2

void sorted_edges(EData *edges,int elen)

{
  EData EVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  int j;
  long lVar5;
  
  uVar2 = 0;
  uVar3 = 0;
  if (0 < elen) {
    uVar3 = (ulong)(uint)elen;
  }
  lVar4 = 1;
  for (; lVar5 = lVar4, uVar2 != uVar3; uVar2 = uVar2 + 1) {
    for (; (int)lVar5 < elen; lVar5 = lVar5 + 1) {
      if (edges[lVar5].weight < edges[uVar2].weight) {
        EVar1 = edges[uVar2];
        edges[uVar2] = edges[lVar5];
        edges[lVar5] = EVar1;
      }
    }
    lVar4 = lVar4 + 1;
  }
  return;
}

Assistant:

void sorted_edges(EData* edges, int elen)
{
    int i,j;

    for (int i = 0; i < elen; ++i) {
        for (int j = i + 1; j < elen; ++j) {
            if (edges[i].weight > edges[j].weight){
                //交换"第i条边"和"第j条边"
                EData tmp = edges[i];
                edges[i] = edges[j];
                edges[j] = tmp;
            }
        }
    }
}